

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::reset(Tokenizer *this)

{
  this->state = st_before_token;
  this->type = tt_bad;
  (this->val)._M_string_length = 0;
  *(this->val)._M_dataplus._M_p = '\0';
  (this->raw_val)._M_string_length = 0;
  *(this->raw_val)._M_dataplus._M_p = '\0';
  std::__cxx11::string::assign((char *)&this->error_message);
  this->before_token = true;
  this->in_token = false;
  this->char_to_unread = '\0';
  this->inline_image_bytes = 0;
  this->string_depth = 0;
  this->bad = false;
  return;
}

Assistant:

void
Tokenizer::reset()
{
    state = st_before_token;
    type = tt::tt_bad;
    val.clear();
    raw_val.clear();
    error_message = "";
    before_token = true;
    in_token = false;
    char_to_unread = '\0';
    inline_image_bytes = 0;
    string_depth = 0;
    bad = false;
}